

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O2

uint32 __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::UnescapeToTempBuf
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr p,EncodedCharPtr last)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint ch;
  EncodedCharPtr local_48;
  EncodedCharPtr p_local;
  bool local_36;
  bool local_35;
  codepoint_t codePoint;
  bool hasEscape;
  bool isMultiChar;
  char16 lower;
  char16 upper;
  
  (this->m_tempChBuf).m_ichCur = 0;
  local_48 = p;
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    if (last <= p) {
      return (this->m_tempChBuf).m_ichCur;
    }
    bVar2 = TryReadCodePoint<false>
                      (this,&local_48,last,(codepoint_t *)((long)&p_local + 4),&local_36,&local_35);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                         ,0x22c,"(gotCodePoint)","gotCodePoint");
      if (!bVar2) goto LAB_00d5762a;
      *puVar3 = 0;
    }
    if (0x10ffff < p_local._4_4_) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                         ,0x22d,"(codePoint < 0x110000)","codePoint < 0x110000");
      if (!bVar2) {
LAB_00d5762a:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    ch = p_local._4_4_;
    if (0xffff < p_local._4_4_) {
      Js::NumberUtilities::CodePointAsSurrogatePair
                (p_local._4_4_,(char16 *)&codePoint,(char16 *)((long)&codePoint + 2));
      TemporaryBuffer::AppendCh<true>(&this->m_tempChBuf,(uint)(ushort)codePoint);
      ch = (uint)codePoint._2_2_;
    }
    TemporaryBuffer::AppendCh<true>(&this->m_tempChBuf,ch);
    p = local_48;
  } while( true );
}

Assistant:

uint32 Scanner<EncodingPolicy>::UnescapeToTempBuf(EncodedCharPtr p, EncodedCharPtr last)
{
    m_tempChBuf.Reset();
    while( p < last )
    {
        codepoint_t codePoint;
        bool hasEscape, isMultiChar;
        bool gotCodePoint = TryReadCodePoint<false>(p, last, &codePoint, &hasEscape, &isMultiChar);
        Assert(gotCodePoint);
        Assert(codePoint < 0x110000);
        if (codePoint < 0x10000)
        {
            m_tempChBuf.AppendCh((OLECHAR)codePoint);
        }
        else
        {
            char16 lower, upper;
            Js::NumberUtilities::CodePointAsSurrogatePair(codePoint, &lower, &upper);
            m_tempChBuf.AppendCh(lower);
            m_tempChBuf.AppendCh(upper);
        }
    }
    return m_tempChBuf.m_ichCur;
}